

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

node_t_conflict type_name(c2m_ctx_t c2m_ctx,int no_err_p)

{
  parse_ctx *ppVar1;
  node_t_conflict n;
  node_t_conflict op1;
  node_t_conflict op2;
  pos_t p;
  node_t_conflict local_38;
  node_t_conflict r;
  node_t_conflict op;
  parse_ctx_t parse_ctx;
  int no_err_p_local;
  c2m_ctx_t c2m_ctx_local;
  
  ppVar1 = c2m_ctx->parse_ctx;
  n = spec_qual_list(c2m_ctx,no_err_p);
  if (n == &err_struct) {
    c2m_ctx_local = (c2m_ctx_t)&err_struct;
  }
  else {
    if (((short)*(undefined4 *)ppVar1->curr_token == 0x29) ||
       ((short)*(undefined4 *)ppVar1->curr_token == 0x3a)) {
      p = get_node_pos(c2m_ctx,n);
      op1 = new_node(c2m_ctx,N_IGNORE);
      op2 = new_node(c2m_ctx,N_LIST);
      local_38 = new_pos_node2(c2m_ctx,N_DECL,p,op1,op2);
    }
    else {
      local_38 = abstract_declarator(c2m_ctx,no_err_p);
      if (local_38 == &err_struct) {
        return &err_struct;
      }
    }
    c2m_ctx_local = (c2m_ctx_t)new_node2(c2m_ctx,N_TYPE,n,local_38);
  }
  return (node_t_conflict)c2m_ctx_local;
}

Assistant:

D (type_name) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  node_t op, r;

  P (spec_qual_list);
  op = r;
  if (!C (')') && !C (':')) {
    P (abstract_declarator);
  } else {
    r = new_pos_node2 (c2m_ctx, N_DECL, POS (op), new_node (c2m_ctx, N_IGNORE),
                       new_node (c2m_ctx, N_LIST));
  }
  return new_node2 (c2m_ctx, N_TYPE, op, r);
}